

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult * __thiscall
testing::AssertionResult::operator<<(AssertionResult *this,char (*value) [231])

{
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_20;
  
  Message::Message((Message *)&local_20);
  std::operator<<((ostream *)(local_20.ptr_ + 0x10),*value);
  AppendMessage(this,(Message *)&local_20);
  internal::
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~scoped_ptr(&local_20);
  return this;
}

Assistant:

AssertionResult& operator<<(const T& value) {
    AppendMessage(Message() << value);
    return *this;
  }